

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

void __thiscall
QGridLayout::addLayout(QGridLayout *this,QLayout *layout,int row,int column,Alignment alignment)

{
  long lVar1;
  bool bVar2;
  QGridLayoutPrivate *this_00;
  QGridBox *this_01;
  long in_RSI;
  QGridLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  QGridBox *b;
  QGridLayoutPrivate *d;
  QLayout *in_stack_ffffffffffffffb8;
  QGridBox *box;
  QLayout *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGridLayout *)0x335f3c);
  bVar2 = QLayoutPrivate::checkLayout(&this_00->super_QLayoutPrivate,in_stack_ffffffffffffffc8);
  if ((bVar2) && (bVar2 = QLayout::adoptLayout((QLayout *)in_RDI,in_stack_ffffffffffffffb8), bVar2))
  {
    this_01 = (QGridBox *)operator_new(0x18);
    box = (QGridBox *)0x0;
    if (in_RSI != 0) {
      box = (QGridBox *)(in_RSI + 0x10);
    }
    QGridBox::QGridBox(this_01,(QLayoutItem *)box);
    QGridBox::setAlignment
              ((QGridBox *)0x335fce,
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)this_01 >> 0x20,0));
    QGridLayoutPrivate::add(in_RDI,box,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGridLayout::addLayout(QLayout *layout, int row, int column, Qt::Alignment alignment)
{
    Q_D(QGridLayout);
    if (!d->checkLayout(layout))
        return;
    if (!adoptLayout(layout))
        return;
    QGridBox *b = new QGridBox(layout);
    b->setAlignment(alignment);
    d->add(b, row, column);
}